

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::tuple<>_&> * testing::A<std::tuple<>const&>(void)

{
  testing *this;
  MatcherInterface<const_std::tuple<>_&> *impl;
  Matcher<const_std::tuple<>_&> *in_RDI;
  
  this = (testing *)operator_new(8);
  memset(this,0,8);
  internal::AnyMatcherImpl<const_std::tuple<>_&>::AnyMatcherImpl
            ((AnyMatcherImpl<const_std::tuple<>_&> *)this);
  MakeMatcher<std::tuple<>const&>(in_RDI,this,impl);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }